

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
duckdb::make_uniq_base<duckdb::LogicalOperator,duckdb::LogicalDummyScan,unsigned_long&>
          (unsigned_long *args)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> in_RDI;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> this;
  
  this._M_head_impl = in_RDI._M_head_impl;
  operator_new(0x70);
  LogicalDummyScan::LogicalDummyScan
            ((LogicalDummyScan *)this._M_head_impl,(idx_t)in_RDI._M_head_impl);
  unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
  unique_ptr<std::default_delete<duckdb::LogicalOperator>,void>
            ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)this._M_head_impl,in_RDI._M_head_impl);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )this._M_head_impl;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}